

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O1

void __thiscall QLibrary::setFileNameAndVersion(QLibrary *this,QString *fileName,QString *version)

{
  ulong uVar1;
  QFlagsStorage<QLibrary::LoadHint> loadHints;
  QLibraryPrivate *pQVar2;
  
  uVar1 = (this->d).d;
  loadHints.i = 0;
  if (7 < uVar1) {
    pQVar2 = (QLibraryPrivate *)(uVar1 & 0xfffffffffffffff8);
    loadHints.i = (pQVar2->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                  _q_value.super___atomic_base<int>._M_i;
    QLibraryStore::releaseLibrary(pQVar2);
  }
  pQVar2 = QLibraryStore::findOrCreate(fileName,version,(LoadHints)loadHints.i);
  (this->d).d = (quintptr)pQVar2;
  return;
}

Assistant:

void QLibrary::setFileNameAndVersion(const QString &fileName, const QString &version)
{
    QLibrary::LoadHints lh;
    if (d) {
        lh = d->loadHints();
        d->release();
    }
    QLibraryPrivate *dd = QLibraryPrivate::findOrCreate(fileName, version, lh);
    d = QTaggedPointer(dd, NotLoaded);      // we haven't load()ed
}